

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

string * google::protobuf::compiler::js::anon_unknown_0::ModuleAlias
                   (string *__return_storage_ptr__,string *filename)

{
  string basename;
  
  StripProto(&basename,filename);
  StripString(&basename,"-",'$');
  StripString(&basename,"/",'_');
  std::operator+(__return_storage_ptr__,&basename,"_pb");
  std::__cxx11::string::~string((string *)&basename);
  return __return_storage_ptr__;
}

Assistant:

string ModuleAlias(const string& filename) {
  // This scheme could technically cause problems if a file includes any 2 of:
  //   foo/bar_baz.proto
  //   foo_bar_baz.proto
  //   foo_bar/baz.proto
  //
  // We'll worry about this problem if/when we actually see it.  This name isn't
  // exposed to users so we can change it later if we need to.
  string basename = StripProto(filename);
  StripString(&basename, "-", '$');
  StripString(&basename, "/", '_');
  return basename + "_pb";
}